

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void purge(h2o_cache_t *cache,uint64_t now)

{
  st_h2o_linklist_t *psVar1;
  khint_t kVar2;
  
  while( true ) {
    if (cache->size <= cache->capacity) {
      while ((psVar1 = (cache->age).next, psVar1 != &cache->age &&
             ((long)((long)psVar1[-3].next + (cache->duration - now)) < 0))) {
        kVar2 = kh_get_cache(cache->table,(h2o_cache_ref_t *)&psVar1[-5].prev);
        erase_ref(cache,kVar2,0);
      }
      return;
    }
    psVar1 = (cache->lru).next;
    if (psVar1 == &cache->lru) break;
    kVar2 = kh_get_cache(cache->table,(h2o_cache_ref_t *)&psVar1[-4].prev);
    erase_ref(cache,kVar2,0);
  }
  __assert_fail("!h2o_linklist_is_empty(&cache->lru)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/cache.c"
                ,0x5c,"void purge(h2o_cache_t *, uint64_t)");
}

Assistant:

static void purge(h2o_cache_t *cache, uint64_t now)
{
    /* by cache size */
    while (cache->capacity < cache->size) {
        h2o_cache_ref_t *last;
        assert(!h2o_linklist_is_empty(&cache->lru));
        last = H2O_STRUCT_FROM_MEMBER(h2o_cache_ref_t, _lru_link, cache->lru.next);
        erase_ref(cache, kh_get(cache, cache->table, last), 0);
    }
    /* by TTL */
    while (!h2o_linklist_is_empty(&cache->age)) {
        h2o_cache_ref_t *oldest = H2O_STRUCT_FROM_MEMBER(h2o_cache_ref_t, _age_link, cache->age.next);
        if (get_timeleft(cache, oldest, now) >= 0)
            break;
        erase_ref(cache, kh_get(cache, cache->table, oldest), 0);
    }
}